

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack9_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x200 | *out;
  *out = (in[2] - base) * 0x40000 | *out;
  *out = (in[3] - base) * 0x8000000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[3] - base >> 5;
  *puVar1 = (in[4] - base) * 0x10 | *puVar1;
  *puVar1 = (in[5] - base) * 0x2000 | *puVar1;
  *puVar1 = (in[6] - base) * 0x400000 | *puVar1;
  *puVar1 = (in[7] - base) * -0x80000000 | *puVar1;
  out[2] = in[7] - base >> 1;
  return out + 3;
}

Assistant:

uint32_t * pack9_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 9  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 9  -  8 );
    ++in;

    return out + 1;
}